

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O2

void P_ResetSightCounters(bool full)

{
  undefined3 in_register_00000039;
  
  if (CONCAT31(in_register_00000039,full) != 0) {
    MaxSightCycles.Sec = 0.0;
  }
  if (MaxSightCycles.Sec < SightCycles.Sec) {
    MaxSightCycles = SightCycles;
  }
  SightCycles.Sec = 0.0;
  sightcounts[0] = 0;
  sightcounts[1] = 0;
  sightcounts[2] = 0;
  sightcounts[3] = 0;
  sightcounts[4] = 0;
  sightcounts[5] = 0;
  return;
}

Assistant:

void P_ResetSightCounters (bool full)
{
	if (full)
	{
		MaxSightCycles.Reset();
	}
	if (SightCycles.Time() > MaxSightCycles.Time())
	{
		MaxSightCycles = SightCycles;
	}
	SightCycles.Reset();
	memset (sightcounts, 0, sizeof(sightcounts));
}